

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.h
# Opt level: O2

bool __thiscall DyndepParser::ParseTest(DyndepParser *this,string *input,string *err)

{
  int iVar1;
  allocator<char> local_41;
  string local_40 [32];
  
  std::__cxx11::string::string<std::allocator<char>>(local_40,"input",&local_41);
  iVar1 = (**(this->super_Parser)._vptr_Parser)(this,local_40,input,err);
  std::__cxx11::string::~string(local_40);
  return SUB41(iVar1,0);
}

Assistant:

bool ParseTest(const std::string& input, std::string* err) {
    return Parse("input", input, err);
  }